

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O2

void tokdefine(tokcxdef *ctx,char *p,int len)

{
  char cVar1;
  int len_00;
  tokdfdef *ptVar2;
  ushort **ppuVar3;
  char *pcVar4;
  uint uVar5;
  char *pcVar7;
  char *expan;
  bool bVar8;
  char mysym [39];
  ulong uVar6;
  
  len_00 = tok_scan_defsym(ctx,p,len);
  if (len_00 != 0) {
    ptVar2 = tok_find_define(ctx,p,len_00);
    if (ptVar2 != (tokdfdef *)0x0) {
      errlogf(ctx->tokcxerr,"TADS",0x75);
      return;
    }
    pcVar7 = p + len_00;
    uVar5 = len - len_00;
    uVar6 = (ulong)uVar5;
    pcVar4 = pcVar7 + uVar6;
    while (((bVar8 = uVar5 != 0, uVar5 = uVar5 - 1, expan = pcVar4, bVar8 &&
            (cVar1 = *pcVar7, expan = pcVar7, -1 < (long)cVar1)) &&
           (ppuVar3 = __ctype_b_loc(), (*(byte *)((long)*ppuVar3 + (long)cVar1 * 2 + 1) & 0x20) != 0
           ))) {
      pcVar7 = pcVar7 + 1;
      uVar6 = (ulong)uVar5;
    }
    pcVar4 = tok_casefold_defsym(ctx,mysym,p,len_00);
    tok_add_define(ctx,pcVar4,len_00,expan,(int)uVar6);
  }
  return;
}

Assistant:

static void tokdefine(tokcxdef *ctx, char *p, int len)
{
    char *sym;
    int   symlen;
    char *expan;
    char  mysym[TOKNAMMAX];
    
    /* get the symbol */
    sym = p;
    if (!(symlen = tok_scan_defsym(ctx, p, len)))
        return;

    /* if it's already in the table, log an error */
    if (tok_find_define(ctx, sym, symlen))
    {
        errlog(ctx->tokcxerr, ERR_DEFREDEF);
        return;
    }

    /* skip whitespace following the symbol */
    expan = sym + symlen;
    len -= symlen;
    while (len && t_isspace(*expan)) --len, ++expan;

    /* if we're folding case, convert the symbol to lower case */
    sym = tok_casefold_defsym(ctx, mysym, sym, symlen);

    /* define the symbol */
    tok_add_define(ctx, sym, symlen, expan, len);
}